

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O1

void HTS_Model_get_index(HTS_Model *model,size_t state_index,char *string,size_t *tree_index,
                        size_t *pdf_index)

{
  _HTS_Pattern **pp_Var1;
  _HTS_Tree **pp_Var2;
  HTS_Tree *pHVar3;
  HTS_Pattern *pHVar4;
  HTS_Boolean HVar5;
  size_t sVar6;
  _HTS_Pattern *p_Var7;
  _HTS_Tree *p_Var8;
  HTS_Tree *tree;
  
  *tree_index = 2;
  *pdf_index = 1;
  pHVar3 = model->tree;
  p_Var8 = pHVar3;
  if (pHVar3 != (HTS_Tree *)0x0) {
    do {
      if (p_Var8->state == state_index) {
        pHVar4 = p_Var8->head;
        p_Var7 = pHVar4;
        tree = p_Var8;
        if (pHVar4 == (HTS_Pattern *)0x0) break;
        do {
          HVar5 = HTS_pattern_match(string,p_Var7->string);
          if (HVar5 != '\0') goto LAB_00155ab5;
          pp_Var1 = &p_Var7->next;
          p_Var7 = *pp_Var1;
        } while (*pp_Var1 != (_HTS_Pattern *)0x0);
        if (pHVar4 == (HTS_Pattern *)0x0) break;
      }
      *tree_index = *tree_index + 1;
      pp_Var2 = &p_Var8->next;
      tree = pHVar3;
      p_Var8 = *pp_Var2;
    } while (*pp_Var2 != (_HTS_Tree *)0x0);
LAB_00155ab5:
    sVar6 = HTS_Tree_search_node(tree,string);
    *pdf_index = sVar6;
  }
  return;
}

Assistant:

static void HTS_Model_get_index(HTS_Model * model, size_t state_index, const char *string, size_t * tree_index, size_t * pdf_index)
{
   HTS_Tree *tree;
   HTS_Pattern *pattern;
   HTS_Boolean find;

   (*tree_index) = 2;
   (*pdf_index) = 1;

   if (model->tree == NULL)
      return;

   find = FALSE;
   for (tree = model->tree; tree; tree = tree->next) {
      if (tree->state == state_index) {
         pattern = tree->head;
         if (!pattern)
            find = TRUE;
         for (; pattern; pattern = pattern->next)
            if (HTS_pattern_match(string, pattern->string)) {
               find = TRUE;
               break;
            }
         if (find)
            break;
      }
      (*tree_index)++;
   }

   if (tree != NULL) {
      (*pdf_index) = HTS_Tree_search_node(tree, string);
   } else {
      (*pdf_index) = HTS_Tree_search_node(model->tree, string);
   }
}